

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmac.c
# Opt level: O0

int cmac_test_subkeys(int verbose,char *testname,uchar *key,int keybits,uchar *subkeys,
                     mbedtls_cipher_type_t cipher_type,int block_size,int num_tests)

{
  mbedtls_cipher_info_t *cipher_info_00;
  uchar local_c8 [8];
  uchar K2 [16];
  uchar K1 [16];
  mbedtls_cipher_info_t *cipher_info;
  mbedtls_cipher_context_t ctx;
  int local_38;
  int ret;
  int i;
  mbedtls_cipher_type_t cipher_type_local;
  uchar *subkeys_local;
  int keybits_local;
  uchar *key_local;
  char *testname_local;
  int verbose_local;
  
  ctx.cmac_ctx._4_4_ = 0;
  cipher_info_00 = mbedtls_cipher_info_from_type(cipher_type);
  if (cipher_info_00 == (mbedtls_cipher_info_t *)0x0) {
    testname_local._4_4_ = -0x6080;
  }
  else {
    for (local_38 = 0; local_38 < num_tests; local_38 = local_38 + 1) {
      if (verbose != 0) {
        printf("  %s CMAC subkey #%u: ",testname,(ulong)(local_38 + 1));
      }
      mbedtls_cipher_init((mbedtls_cipher_context_t *)&cipher_info);
      ctx.cmac_ctx._4_4_ =
           mbedtls_cipher_setup((mbedtls_cipher_context_t *)&cipher_info,cipher_info_00);
      if (ctx.cmac_ctx._4_4_ != 0) {
        if (verbose != 0) {
          printf("test execution failed\n");
        }
LAB_00134ec5:
        mbedtls_cipher_free((mbedtls_cipher_context_t *)&cipher_info);
        goto LAB_00134ed1;
      }
      ctx.cmac_ctx._4_4_ =
           mbedtls_cipher_setkey
                     ((mbedtls_cipher_context_t *)&cipher_info,key,keybits,MBEDTLS_ENCRYPT);
      if (ctx.cmac_ctx._4_4_ != 0) {
        if (verbose != 0) {
          printf("test execution failed\n");
        }
        goto LAB_00134ec5;
      }
      ctx.cmac_ctx._4_4_ =
           cmac_generate_subkeys((mbedtls_cipher_context_t *)&cipher_info,K2 + 8,local_c8);
      if (ctx.cmac_ctx._4_4_ != 0) {
        if (verbose != 0) {
          printf("failed\n");
        }
        goto LAB_00134ec5;
      }
      ctx.cmac_ctx._4_4_ = memcmp(K2 + 8,subkeys,(long)block_size);
      if ((ctx.cmac_ctx._4_4_ != 0) ||
         (ctx.cmac_ctx._4_4_ = memcmp(local_c8,subkeys + block_size,(long)block_size),
         ctx.cmac_ctx._4_4_ != 0)) {
        if (verbose != 0) {
          printf("failed\n");
        }
        goto LAB_00134ec5;
      }
      if (verbose != 0) {
        printf("passed\n");
      }
      mbedtls_cipher_free((mbedtls_cipher_context_t *)&cipher_info);
    }
    ctx.cmac_ctx._4_4_ = 0;
LAB_00134ed1:
    testname_local._4_4_ = ctx.cmac_ctx._4_4_;
  }
  return testname_local._4_4_;
}

Assistant:

static int cmac_test_subkeys( int verbose,
                              const char* testname,
                              const unsigned char* key,
                              int keybits,
                              const unsigned char* subkeys,
                              mbedtls_cipher_type_t cipher_type,
                              int block_size,
                              int num_tests )
{
    int i, ret = 0;
    mbedtls_cipher_context_t ctx;
    const mbedtls_cipher_info_t *cipher_info;
    unsigned char K1[MBEDTLS_CIPHER_BLKSIZE_MAX];
    unsigned char K2[MBEDTLS_CIPHER_BLKSIZE_MAX];

    cipher_info = mbedtls_cipher_info_from_type( cipher_type );
    if( cipher_info == NULL )
    {
        /* Failing at this point must be due to a build issue */
        return( MBEDTLS_ERR_CIPHER_FEATURE_UNAVAILABLE );
    }

    for( i = 0; i < num_tests; i++ )
    {
        if( verbose != 0 )
            mbedtls_printf( "  %s CMAC subkey #%u: ", testname, i + 1 );

        mbedtls_cipher_init( &ctx );

        if( ( ret = mbedtls_cipher_setup( &ctx, cipher_info ) ) != 0 )
        {
            if( verbose != 0 )
                mbedtls_printf( "test execution failed\n" );

            goto cleanup;
        }

        if( ( ret = mbedtls_cipher_setkey( &ctx, key, keybits,
                                       MBEDTLS_ENCRYPT ) ) != 0 )
        {
            if( verbose != 0 )
                mbedtls_printf( "test execution failed\n" );

            goto cleanup;
        }

        ret = cmac_generate_subkeys( &ctx, K1, K2 );
        if( ret != 0 )
        {
           if( verbose != 0 )
                mbedtls_printf( "failed\n" );

            goto cleanup;
        }

        if( ( ret = memcmp( K1, subkeys, block_size ) ) != 0  ||
            ( ret = memcmp( K2, &subkeys[block_size], block_size ) ) != 0 )
        {
            if( verbose != 0 )
                mbedtls_printf( "failed\n" );

            goto cleanup;
        }

        if( verbose != 0 )
            mbedtls_printf( "passed\n" );

        mbedtls_cipher_free( &ctx );
    }

    ret = 0;
    goto exit;

cleanup:
    mbedtls_cipher_free( &ctx );

exit:
    return( ret );
}